

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::ButtonBehavior
               (ImRect *bb,ImGuiID id,bool *out_hovered,bool *out_held,ImGuiButtonFlags flags)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ImGuiWindow *window_00;
  ImGuiInputReadMode mode;
  ImVec2 IVar6;
  bool local_55;
  bool local_52;
  bool held;
  bool nav_activated_by_inputs;
  bool nav_activated_by_code;
  bool hovered;
  bool pressed;
  ImGuiWindow *backup_hovered_window;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiButtonFlags flags_local;
  bool *out_held_local;
  bool *out_hovered_local;
  ImGuiID id_local;
  ImRect *bb_local;
  
  pIVar2 = GImGui;
  window_00 = GetCurrentWindow();
  if ((flags & 0x100U) == 0) {
    g._4_4_ = flags;
    if ((flags & 0x1eU) == 0) {
      g._4_4_ = flags | 2;
    }
    pIVar1 = pIVar2->HoveredWindow;
    if (((g._4_4_ & 0x20) != 0) && (pIVar2->HoveredRootWindow == window_00)) {
      pIVar2->HoveredWindow = window_00;
    }
    bb_local._7_1_ = false;
    local_52 = ItemHoverable(bb,id);
    if (((((g._4_4_ & 0x1000) != 0) && ((pIVar2->DragDropActive & 1U) != 0)) &&
        ((pIVar2->DragDropSourceFlags & 4U) == 0)) && (bVar3 = IsItemHovered(0x20), bVar3)) {
      local_52 = true;
      SetHoveredID(id);
      iVar5 = CalcTypematicPressedRepeatAmount
                        (pIVar2->HoveredIdTimer + 0.0001,
                         (pIVar2->HoveredIdTimer + 0.0001) - (pIVar2->IO).DeltaTime,0.01,0.7);
      bb_local._7_1_ = iVar5 != 0;
      if (bb_local._7_1_) {
        FocusWindow(window_00);
      }
    }
    if (((g._4_4_ & 0x20) != 0) && (pIVar2->HoveredRootWindow == window_00)) {
      pIVar2->HoveredWindow = pIVar1;
    }
    if (((local_52 != false) && ((g._4_4_ & 0x40) != 0)) &&
       ((pIVar2->HoveredIdPreviousFrame != id && (pIVar2->HoveredIdPreviousFrame != 0)))) {
      local_52 = false;
    }
    if (local_52 != false) {
      if (((g._4_4_ & 0x400) == 0) ||
         (((((pIVar2->IO).KeyCtrl & 1U) == 0 && (((pIVar2->IO).KeyShift & 1U) == 0)) &&
          (((pIVar2->IO).KeyAlt & 1U) == 0)))) {
        if (((g._4_4_ & 2) != 0) && (((pIVar2->IO).MouseClicked[0] & 1U) != 0)) {
          SetActiveID(id,window_00);
          if ((g._4_4_ & 0x2000) == 0) {
            SetFocusID(id,window_00);
          }
          FocusWindow(window_00);
        }
        if ((((g._4_4_ & 4) != 0) && (((pIVar2->IO).MouseClicked[0] & 1U) != 0)) ||
           (((g._4_4_ & 0x10) != 0 && (((pIVar2->IO).MouseDoubleClicked[0] & 1U) != 0)))) {
          bb_local._7_1_ = true;
          if ((g._4_4_ & 0x800) == 0) {
            SetActiveID(id,window_00);
          }
          else {
            ClearActiveID();
          }
          FocusWindow(window_00);
        }
        if (((g._4_4_ & 8) != 0) && (((pIVar2->IO).MouseReleased[0] & 1U) != 0)) {
          if (((g._4_4_ & 1) == 0) ||
             ((pIVar2->IO).MouseDownDurationPrev[0] < (pIVar2->IO).KeyRepeatDelay)) {
            bb_local._7_1_ = true;
          }
          ClearActiveID();
        }
        if (((((g._4_4_ & 1) != 0) && (pIVar2->ActiveId == id)) &&
            (0.0 < (pIVar2->IO).MouseDownDuration[0])) && (bVar3 = IsMouseClicked(0,true), bVar3)) {
          bb_local._7_1_ = true;
        }
      }
      if (bb_local._7_1_ != false) {
        pIVar2->NavDisableHighlight = true;
      }
    }
    if ((((pIVar2->NavId == id) && ((pIVar2->NavDisableHighlight & 1U) == 0)) &&
        ((pIVar2->NavDisableMouseHover & 1U) != 0)) &&
       (((pIVar2->ActiveId == 0 || (pIVar2->ActiveId == id)) ||
        (pIVar2->ActiveId == window_00->MoveId)))) {
      local_52 = true;
    }
    if (pIVar2->NavActivateDownId == id) {
      bVar3 = pIVar2->NavActivateId == id;
      mode = ImGuiInputReadMode_Pressed;
      if ((g._4_4_ & 1) != 0) {
        mode = ImGuiInputReadMode_Repeat;
      }
      bVar4 = IsNavInputPressed(0,mode);
      if ((bVar3) || (bVar4)) {
        bb_local._7_1_ = true;
      }
      if (((bVar3) || (bVar4)) || (pIVar2->ActiveId == id)) {
        pIVar2->NavActivateId = id;
        SetActiveID(id,window_00);
        if ((g._4_4_ & 0x2000) == 0) {
          SetFocusID(id,window_00);
        }
        pIVar2->ActiveIdAllowNavDirFlags = 0xf;
      }
    }
    local_55 = false;
    if (pIVar2->ActiveId == id) {
      if (pIVar2->ActiveIdSource == ImGuiInputSource_Mouse) {
        if ((pIVar2->ActiveIdIsJustActivated & 1U) != 0) {
          IVar6 = ::operator-(&(pIVar2->IO).MousePos,&bb->Min);
          pIVar2->ActiveIdClickOffset = IVar6;
        }
        if (((pIVar2->IO).MouseDown[0] & 1U) == 0) {
          if ((((local_52 != false) && ((g._4_4_ & 2) != 0)) &&
              (((g._4_4_ & 1) == 0 ||
               ((pIVar2->IO).MouseDownDurationPrev[0] < (pIVar2->IO).KeyRepeatDelay)))) &&
             ((pIVar2->DragDropActive & 1U) == 0)) {
            bb_local._7_1_ = true;
          }
          ClearActiveID();
        }
        else {
          local_55 = true;
        }
        if ((g._4_4_ & 0x2000) == 0) {
          pIVar2->NavDisableHighlight = true;
        }
      }
      else if ((pIVar2->ActiveIdSource == ImGuiInputSource_Nav) && (pIVar2->NavActivateDownId != id)
              ) {
        ClearActiveID();
      }
    }
    if (out_hovered != (bool *)0x0) {
      *out_hovered = local_52;
    }
    if (out_held != (bool *)0x0) {
      *out_held = local_55;
    }
  }
  else {
    if (out_hovered != (bool *)0x0) {
      *out_hovered = false;
    }
    if (out_held != (bool *)0x0) {
      *out_held = false;
    }
    if (pIVar2->ActiveId == id) {
      ClearActiveID();
    }
    bb_local._7_1_ = false;
  }
  return bb_local._7_1_;
}

Assistant:

bool ImGui::ButtonBehavior(const ImRect& bb, ImGuiID id, bool* out_hovered, bool* out_held, ImGuiButtonFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    if (flags & ImGuiButtonFlags_Disabled)
    {
        if (out_hovered) *out_hovered = false;
        if (out_held) *out_held = false;
        if (g.ActiveId == id) ClearActiveID();
        return false;
    }

    // Default behavior requires click+release on same spot
    if ((flags & (ImGuiButtonFlags_PressedOnClickRelease | ImGuiButtonFlags_PressedOnClick | ImGuiButtonFlags_PressedOnRelease | ImGuiButtonFlags_PressedOnDoubleClick)) == 0)
        flags |= ImGuiButtonFlags_PressedOnClickRelease;

    ImGuiWindow* backup_hovered_window = g.HoveredWindow;
    if ((flags & ImGuiButtonFlags_FlattenChildren) && g.HoveredRootWindow == window)
        g.HoveredWindow = window;

    bool pressed = false;
    bool hovered = ItemHoverable(bb, id);

    // Special mode for Drag and Drop where holding button pressed for a long time while dragging another item triggers the button
    if ((flags & ImGuiButtonFlags_PressedOnDragDropHold) && g.DragDropActive && !(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoHoldToOpenOthers))
        if (IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByActiveItem))
        {
            hovered = true;
            SetHoveredID(id);
            if (CalcTypematicPressedRepeatAmount(g.HoveredIdTimer + 0.0001f, g.HoveredIdTimer + 0.0001f - g.IO.DeltaTime, 0.01f, 0.70f)) // FIXME: Our formula for CalcTypematicPressedRepeatAmount() is fishy
            {
                pressed = true;
                FocusWindow(window);
            }
        }

    if ((flags & ImGuiButtonFlags_FlattenChildren) && g.HoveredRootWindow == window)
        g.HoveredWindow = backup_hovered_window;

    // AllowOverlap mode (rarely used) requires previous frame HoveredId to be null or to match. This allows using patterns where a later submitted widget overlaps a previous one.
    if (hovered && (flags & ImGuiButtonFlags_AllowItemOverlap) && (g.HoveredIdPreviousFrame != id && g.HoveredIdPreviousFrame != 0))
        hovered = false;

    // Mouse
    if (hovered)
    {
        if (!(flags & ImGuiButtonFlags_NoKeyModifiers) || (!g.IO.KeyCtrl && !g.IO.KeyShift && !g.IO.KeyAlt))
        {
            //                        | CLICKING        | HOLDING with ImGuiButtonFlags_Repeat
            // PressedOnClickRelease  |  <on release>*  |  <on repeat> <on repeat> .. (NOT on release)  <-- MOST COMMON! (*) only if both click/release were over bounds
            // PressedOnClick         |  <on click>     |  <on click> <on repeat> <on repeat> ..
            // PressedOnRelease       |  <on release>   |  <on repeat> <on repeat> .. (NOT on release)
            // PressedOnDoubleClick   |  <on dclick>    |  <on dclick> <on repeat> <on repeat> ..
            // FIXME-NAV: We don't honor those different behaviors.
            if ((flags & ImGuiButtonFlags_PressedOnClickRelease) && g.IO.MouseClicked[0])
            {
                SetActiveID(id, window);
                if (!(flags & ImGuiButtonFlags_NoNavFocus))
                    SetFocusID(id, window);
                FocusWindow(window);
            }
            if (((flags & ImGuiButtonFlags_PressedOnClick) && g.IO.MouseClicked[0]) || ((flags & ImGuiButtonFlags_PressedOnDoubleClick) && g.IO.MouseDoubleClicked[0]))
            {
                pressed = true;
                if (flags & ImGuiButtonFlags_NoHoldingActiveID)
                    ClearActiveID();
                else
                    SetActiveID(id, window); // Hold on ID
                FocusWindow(window);
            }
            if ((flags & ImGuiButtonFlags_PressedOnRelease) && g.IO.MouseReleased[0])
            {
                if (!((flags & ImGuiButtonFlags_Repeat) && g.IO.MouseDownDurationPrev[0] >= g.IO.KeyRepeatDelay))  // Repeat mode trumps <on release>
                    pressed = true;
                ClearActiveID();
            }

            // 'Repeat' mode acts when held regardless of _PressedOn flags (see table above).
            // Relies on repeat logic of IsMouseClicked() but we may as well do it ourselves if we end up exposing finer RepeatDelay/RepeatRate settings.
            if ((flags & ImGuiButtonFlags_Repeat) && g.ActiveId == id && g.IO.MouseDownDuration[0] > 0.0f && IsMouseClicked(0, true))
                pressed = true;
        }

        if (pressed)
            g.NavDisableHighlight = true;
    }

    // Gamepad/Keyboard navigation
    // We report navigated item as hovered but we don't set g.HoveredId to not interfere with mouse.
    if (g.NavId == id && !g.NavDisableHighlight && g.NavDisableMouseHover && (g.ActiveId == 0 || g.ActiveId == id || g.ActiveId == window->MoveId))
        hovered = true;

    if (g.NavActivateDownId == id)
    {
        bool nav_activated_by_code = (g.NavActivateId == id);
        bool nav_activated_by_inputs = IsNavInputPressed(ImGuiNavInput_Activate, (flags & ImGuiButtonFlags_Repeat) ? ImGuiInputReadMode_Repeat : ImGuiInputReadMode_Pressed);
        if (nav_activated_by_code || nav_activated_by_inputs)
            pressed = true;
        if (nav_activated_by_code || nav_activated_by_inputs || g.ActiveId == id)
        {
            // Set active id so it can be queried by user via IsItemActive(), equivalent of holding the mouse button.
            g.NavActivateId = id; // This is so SetActiveId assign a Nav source
            SetActiveID(id, window);
            if (!(flags & ImGuiButtonFlags_NoNavFocus))
                SetFocusID(id, window);
            g.ActiveIdAllowNavDirFlags = (1 << ImGuiDir_Left) | (1 << ImGuiDir_Right) | (1 << ImGuiDir_Up) | (1 << ImGuiDir_Down);
        }
    }

    bool held = false;
    if (g.ActiveId == id)
    {
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (g.ActiveIdIsJustActivated)
                g.ActiveIdClickOffset = g.IO.MousePos - bb.Min;
            if (g.IO.MouseDown[0])
            {
                held = true;
            }
            else
            {
                if (hovered && (flags & ImGuiButtonFlags_PressedOnClickRelease))
                    if (!((flags & ImGuiButtonFlags_Repeat) && g.IO.MouseDownDurationPrev[0] >= g.IO.KeyRepeatDelay))  // Repeat mode trumps <on release>
                        if (!g.DragDropActive)
                            pressed = true;
                ClearActiveID();
            }
            if (!(flags & ImGuiButtonFlags_NoNavFocus))
                g.NavDisableHighlight = true;
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            if (g.NavActivateDownId != id)
                ClearActiveID();
        }
    }

    if (out_hovered) *out_hovered = hovered;
    if (out_held) *out_held = held;

    return pressed;
}